

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger table_filter(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  bool bVar2;
  SQObjectPtr *pSVar3;
  SQObjectValue SVar4;
  SQRESULT SVar5;
  SQObjectPtr *o;
  SQInteger SVar6;
  SQObjectPtr itr;
  SQObjectPtr ret;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr local_88;
  SQObjectPtr local_78;
  SQTable *local_68;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  pSVar3 = SQVM::GetAt(v,v->_stackbase);
  local_68 = (pSVar3->super_SQObject)._unVal.pTable;
  ss = v->_sharedstate;
  SVar4.pUserPointer = sq_vm_malloc(0x58);
  SQTable::SQTable(SVar4.pTable,ss,0);
  ((SVar4.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  local_78.super_SQObject._type = OT_TABLE;
  pSVar1 = &((SVar4.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_88.super_SQObject._type = OT_NULL;
  local_88.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_40.super_SQObject._type = OT_NULL;
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_50.super_SQObject._type = OT_NULL;
  local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_78.super_SQObject._unVal.pUserPointer = SVar4.pUserPointer;
  do {
    SVar4.nInteger = SQTable::Next(local_68,false,&local_88,&local_40,&local_50);
    if (SVar4.pTable == (SQTable *)0xffffffffffffffff) {
      SVar6 = 1;
      SQVM::Push(v,&local_78);
LAB_00126675:
      SQObjectPtr::~SQObjectPtr(&local_50);
      SQObjectPtr::~SQObjectPtr(&local_40);
      SQObjectPtr::~SQObjectPtr(&local_88);
      SQObjectPtr::~SQObjectPtr(&local_78);
      return SVar6;
    }
    if ((local_88.super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((local_88.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*((local_88.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    local_88.super_SQObject._type = OT_INTEGER;
    local_60.super_SQObject._type = (pSVar3->super_SQObject)._type;
    local_60.super_SQObject._unVal = (SQObjectValue)(pSVar3->super_SQObject)._unVal.pTable;
    if ((local_60.super_SQObject._type >> 0x1b & 1) != 0) {
      pSVar1 = &((local_60.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    local_88.super_SQObject._unVal.nInteger = SVar4.nInteger;
    SQVM::Push(v,&local_60);
    SQObjectPtr::~SQObjectPtr(&local_60);
    SQVM::Push(v,&local_40);
    SQVM::Push(v,&local_50);
    SVar5 = sq_call(v,3,1,0);
    if (SVar5 < 0) {
      SVar6 = -1;
      goto LAB_00126675;
    }
    o = SQVM::GetUp(v,-1);
    bVar2 = SQVM::IsFalse(o);
    if (!bVar2) {
      SQTable::NewSlot(local_78.super_SQObject._unVal.pTable,&local_40,&local_50);
    }
    SQVM::Pop(v);
  } while( true );
}

Assistant:

static SQInteger table_filter(HSQUIRRELVM v)
{
    SQObject &o = stack_get(v,1);
    SQTable *tbl = _table(o);
    SQObjectPtr ret = SQTable::Create(_ss(v),0);

    SQObjectPtr itr, key, val;
    SQInteger nitr;
    while((nitr = tbl->Next(false, itr, key, val)) != -1) {
        itr = (SQInteger)nitr;

        v->Push(o);
        v->Push(key);
        v->Push(val);
        if(SQ_FAILED(sq_call(v,3,SQTrue,SQFalse))) {
            return SQ_ERROR;
        }
        if(!SQVM::IsFalse(v->GetUp(-1))) {
            _table(ret)->NewSlot(key, val);
        }
        v->Pop();
    }

    v->Push(ret);
    return 1;
}